

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgGoogol.cpp
# Opt level: O1

dgGoogol * __thiscall
dgGoogol::operator+(dgGoogol *__return_storage_ptr__,dgGoogol *this,dgGoogol *A)

{
  short sVar1;
  short sVar2;
  HaI32 HVar3;
  HaU64 carrier_1;
  HaU64 carrier;
  long lVar4;
  ulong uVar5;
  int bits;
  long lVar6;
  ulong uVar7;
  HaU64 HVar8;
  dgGoogol *this_00;
  HaI8 HVar9;
  bool bVar10;
  undefined8 uVar11;
  HaU64 HVar12;
  HaU64 HVar13;
  HaU64 mantissa [4];
  HaU64 mantissa1 [4];
  HaU64 mantissa0 [4];
  HaU64 local_88 [4];
  HaU64 local_68 [4];
  HaU64 local_48 [5];
  
  this_00 = __return_storage_ptr__;
  dgGoogol(__return_storage_ptr__);
  if (A->m_mantissa[0] == 0 || this->m_mantissa[0] == 0) {
    if (A->m_mantissa[0] == 0) {
      __return_storage_ptr__->m_mantissa[3] = this->m_mantissa[3];
      uVar11._0_1_ = this->m_sign;
      uVar11._1_1_ = this->field_0x1;
      uVar11._2_2_ = this->m_exponent;
      uVar11._4_4_ = *(undefined4 *)&this->field_0x4;
      HVar8 = this->m_mantissa[0];
      HVar12 = this->m_mantissa[1];
      HVar13 = this->m_mantissa[2];
    }
    else {
      __return_storage_ptr__->m_mantissa[3] = A->m_mantissa[3];
      uVar11._0_1_ = A->m_sign;
      uVar11._1_1_ = A->field_0x1;
      uVar11._2_2_ = A->m_exponent;
      uVar11._4_4_ = *(undefined4 *)&A->field_0x4;
      HVar8 = A->m_mantissa[0];
      HVar12 = A->m_mantissa[1];
      HVar13 = A->m_mantissa[2];
    }
    __return_storage_ptr__->m_sign = (char)uVar11;
    __return_storage_ptr__->field_0x1 = (char)((ulong)uVar11 >> 8);
    __return_storage_ptr__->m_exponent = (short)((ulong)uVar11 >> 0x10);
    *(int *)&__return_storage_ptr__->field_0x4 = (int)((ulong)uVar11 >> 0x20);
    __return_storage_ptr__->m_mantissa[0] = HVar8;
    __return_storage_ptr__->m_mantissa[1] = HVar12;
    __return_storage_ptr__->m_mantissa[2] = HVar13;
  }
  else {
    local_48[0] = this->m_mantissa[0];
    local_48[1] = this->m_mantissa[1];
    local_48[2] = this->m_mantissa[2];
    local_48[3] = this->m_mantissa[3];
    if (this->m_sign != '\0') {
      lVar4 = 1;
      lVar6 = 3;
      do {
        this_00 = (dgGoogol *)(~local_48[lVar6] + lVar4);
        if (this_00 != (dgGoogol *)0x0) {
          lVar4 = 0;
        }
        local_48[lVar6] = (HaU64)this_00;
        bVar10 = lVar6 != 0;
        lVar6 = lVar6 + -1;
      } while (bVar10);
    }
    local_68[0] = A->m_mantissa[0];
    local_68[1] = A->m_mantissa[1];
    local_68[2] = A->m_mantissa[2];
    local_68[3] = A->m_mantissa[3];
    if (A->m_sign != '\0') {
      lVar4 = 1;
      lVar6 = 3;
      do {
        HVar8 = ~local_68[lVar6] + lVar4;
        if (HVar8 != 0) {
          lVar4 = 0;
        }
        local_68[lVar6] = HVar8;
        bVar10 = lVar6 != 0;
        lVar6 = lVar6 + -1;
      } while (bVar10);
    }
    sVar2 = this->m_exponent;
    sVar1 = A->m_exponent;
    bits = (int)sVar2 - (int)sVar1;
    if (bits == 0 || (int)sVar2 < (int)sVar1) {
      if (bits < 0) {
        ShiftRightMantissa(this_00,local_48,-bits);
        sVar2 = sVar1;
      }
    }
    else {
      ShiftRightMantissa(this_00,local_68,bits);
    }
    lVar4 = 3;
    uVar5 = 0;
    do {
      uVar7 = local_68[lVar4] + local_48[lVar4];
      local_88[lVar4] = uVar7 + uVar5;
      uVar5 = (ulong)(CARRY8(uVar7,uVar5) || CARRY8(local_68[lVar4],local_48[lVar4]));
      bVar10 = lVar4 != 0;
      lVar4 = lVar4 + -1;
    } while (bVar10);
    if ((long)local_88[0] < 0) {
      lVar4 = 1;
      lVar6 = 3;
      do {
        HVar8 = ~local_88[lVar6] + lVar4;
        if (HVar8 != 0) {
          lVar4 = 0;
        }
        local_88[lVar6] = HVar8;
        bVar10 = lVar6 != 0;
        lVar6 = lVar6 + -1;
      } while (bVar10);
      HVar9 = '\x01';
    }
    else {
      HVar9 = '\0';
    }
    HVar3 = NormalizeMantissa(this_00,local_88);
    if (HVar3 < -0xff) {
      __return_storage_ptr__->m_sign = '\0';
      sVar2 = 0;
    }
    else {
      __return_storage_ptr__->m_sign = HVar9;
      sVar2 = (short)HVar3 + sVar2;
    }
    __return_storage_ptr__->m_exponent = sVar2;
    __return_storage_ptr__->m_mantissa[0] = local_88[0];
    __return_storage_ptr__->m_mantissa[1] = local_88[1];
    __return_storage_ptr__->m_mantissa[2] = local_88[2];
    __return_storage_ptr__->m_mantissa[3] = local_88[3];
  }
  return __return_storage_ptr__;
}

Assistant:

dgGoogol dgGoogol::operator+ (const dgGoogol &A) const
{
	dgGoogol tmp;
	if (m_mantissa[0] && A.m_mantissa[0]) {
		hacd::HaU64 mantissa0[DG_GOOGOL_SIZE];
		hacd::HaU64 mantissa1[DG_GOOGOL_SIZE];
		hacd::HaU64 mantissa[DG_GOOGOL_SIZE];

		CopySignedMantissa (mantissa0);
		A.CopySignedMantissa (mantissa1);

		hacd::HaI32 exponetDiff = m_exponent - A.m_exponent;
		hacd::HaI32 exponent = m_exponent;
		if (exponetDiff > 0) {
			ShiftRightMantissa (mantissa1, exponetDiff);
		} else if (exponetDiff < 0) {
			exponent = A.m_exponent;
			ShiftRightMantissa (mantissa0, -exponetDiff);
		} 

		hacd::HaU64 carrier = 0;
		for (hacd::HaI32 i = DG_GOOGOL_SIZE - 1; i >= 0; i --) {
			hacd::HaU64 m0 = mantissa0[i];
			hacd::HaU64 m1 = mantissa1[i];
			mantissa[i] = m0 + m1 + carrier;
			carrier = CheckCarrier (m0, m1) | CheckCarrier (m0 + m1, carrier);
		}

		hacd::HaI8 sign = 0;
		if (hacd::HaI64 (mantissa[0]) < 0) {
			sign = 1;
			NegateMantissa (mantissa);
		}

		hacd::HaI32 bits = NormalizeMantissa (mantissa);
		if (bits <= (-64 * DG_GOOGOL_SIZE)) {
			tmp.m_sign = 0;
			tmp.m_exponent = 0;
		} else {
			tmp.m_sign = sign;
			tmp.m_exponent =  hacd::HaI16 (exponent + bits);
		}

		memcpy (tmp.m_mantissa, mantissa, sizeof (m_mantissa));
		

	} else if (A.m_mantissa[0]) {
		tmp = A;
	} else {
		tmp = *this;
	}

	return tmp;
}